

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::Decode(AttributeRecordSet *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *this_01;
  StandardVariable *this_02;
  KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> local_90;
  KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> local_78;
  StandardVariable *local_60;
  StandardVariable *p;
  KUINT32 datumID;
  KUINT16 pos;
  KUINT16 i;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  AttributeRecordSet *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 8) {
    datumID._3_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    datumID._3_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vAttrRec);
  this_01 = operator>>(local_18,(DataTypeBase *)&this->m_EntityID);
  KDataStream::operator>>(this_01,&this->m_ui16NumAttrRecs);
  for (datumID._0_2_ = 0; (ushort)datumID < this->m_ui16NumAttrRecs;
      datumID._0_2_ = (ushort)datumID + 1) {
    p._6_2_ = KDataStream::GetCurrentWritePosition(local_18);
    KDataStream::operator>>(local_18,(uint *)&p);
    KDataStream::SetCurrentWritePosition(local_18,p._6_2_);
    local_60 = FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
                         ((KINT32)p,local_18);
    if (local_60 == (StandardVariable *)0x0) {
      this_02 = (StandardVariable *)operator_new(0x10);
      StandardVariable::StandardVariable(this_02,local_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr(&local_90,this_02);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
      ::push_back(&this->m_vAttrRec,&local_90);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr(&local_90);
    }
    else {
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr(&local_78,local_60);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
      ::push_back(&this->m_vAttrRec,&local_78);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr(&local_78);
    }
  }
  return;
}

Assistant:

void AttributeRecordSet::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ATTRIBUTE_RECORD_SET_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vAttrRec.clear();

    stream >> KDIS_STREAM m_EntityID
           >> m_ui16NumAttrRecs;

    for( KUINT16 i = 0; i < m_ui16NumAttrRecs; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder. 
        StandardVariable * p = StandardVariable::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vAttrRec.push_back( StdVarPtr( p ) );
        }
        else
        {
            // Default
            m_vAttrRec.push_back( StdVarPtr( new StandardVariable( stream ) ) );
        }
    }
}